

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numpy.h
# Opt level: O1

npy_api * pybind11::detail::npy_api::lookup(void)

{
  _func_uint *p_Var1;
  uint uVar2;
  object *poVar3;
  long lVar4;
  npy_api *in_RDI;
  module_ m;
  str_attr_accessor c;
  handle local_40;
  accessor<pybind11::detail::accessor_policies::str_attr> local_38;
  
  module_::import((module_ *)&local_40,"numpy.core.multiarray");
  local_38.obj.m_ptr = local_40.m_ptr;
  local_38.key = "_ARRAY_API";
  local_38.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
  poVar3 = accessor<pybind11::detail::accessor_policies::str_attr>::get_cache(&local_38);
  lVar4 = PyCapsule_GetPointer((poVar3->super_handle).m_ptr,0);
  p_Var1 = *(_func_uint **)(lVar4 + 0x698);
  in_RDI->PyArray_GetNDArrayCFeatureVersion_ = p_Var1;
  uVar2 = (*p_Var1)();
  if (6 < uVar2) {
    in_RDI->PyArray_Type_ = *(PyTypeObject **)(lVar4 + 0x10);
    in_RDI->PyVoidArrType_Type_ = *(PyTypeObject **)(lVar4 + 0x138);
    in_RDI->PyArrayDescr_Type_ = *(PyTypeObject **)(lVar4 + 0x18);
    in_RDI->PyArray_DescrFromType_ = *(_func_PyObject_ptr_int **)(lVar4 + 0x168);
    in_RDI->PyArray_DescrFromScalar_ = *(_func_PyObject_ptr_PyObject_ptr **)(lVar4 + 0x1c8);
    in_RDI->PyArray_FromAny_ =
         *(_func_PyObject_ptr_PyObject_ptr_PyObject_ptr_int_int_int_PyObject_ptr **)(lVar4 + 0x228);
    in_RDI->PyArray_Resize_ =
         *(_func_PyObject_ptr_PyObject_ptr_PyArray_Dims_ptr_int_int **)(lVar4 + 0x280);
    in_RDI->PyArray_CopyInto_ = *(_func_int_PyObject_ptr_PyObject_ptr **)(lVar4 + 0x290);
    in_RDI->PyArray_NewCopy_ = *(_func_PyObject_ptr_PyObject_ptr_int **)(lVar4 + 0x2a8);
    in_RDI->PyArray_NewFromDescr_ =
         *(_func_PyObject_ptr_PyTypeObject_ptr_PyObject_ptr_int_Py_intptr_t_ptr_Py_intptr_t_ptr_void_ptr_int_PyObject_ptr
           **)(lVar4 + 0x2f0);
    in_RDI->PyArray_DescrNewFromType_ = *(_func_PyObject_ptr_int **)(lVar4 + 0x300);
    in_RDI->PyArray_DescrConverter_ = *(_func_int_PyObject_ptr_PyObject_ptr_ptr **)(lVar4 + 0x570);
    in_RDI->PyArray_EquivTypes_ = *(_func_bool_PyObject_ptr_PyObject_ptr **)(lVar4 + 0x5b0);
    in_RDI->PyArray_GetArrayParamsFromObject_ =
         *(_func_int_PyObject_ptr_PyObject_ptr_uchar_PyObject_ptr_ptr_int_ptr_Py_intptr_t_ptr_PyObject_ptr_ptr_PyObject_ptr
           **)(lVar4 + 0x8b0);
    in_RDI->PyArray_Squeeze_ = *(_func_PyObject_ptr_PyObject_ptr **)(lVar4 + 0x440);
    in_RDI->PyArray_SetBaseObject_ = *(_func_int_PyObject_ptr_PyObject_ptr **)(lVar4 + 0x8d0);
    object::~object(&local_38.cache);
    object::~object((object *)&local_40);
    return in_RDI;
  }
  pybind11_fail("pybind11 numpy support requires numpy >= 1.7.0");
}

Assistant:

static npy_api lookup() {
        module_ m = module_::import("numpy.core.multiarray");
        auto c = m.attr("_ARRAY_API");
#if PY_MAJOR_VERSION >= 3
        void **api_ptr = (void **) PyCapsule_GetPointer(c.ptr(), NULL);
#else
        void **api_ptr = (void **) PyCObject_AsVoidPtr(c.ptr());
#endif
        npy_api api;
#define DECL_NPY_API(Func) api.Func##_ = (decltype(api.Func##_)) api_ptr[API_##Func];
        DECL_NPY_API(PyArray_GetNDArrayCFeatureVersion);
        if (api.PyArray_GetNDArrayCFeatureVersion_() < 0x7)
            pybind11_fail("pybind11 numpy support requires numpy >= 1.7.0");
        DECL_NPY_API(PyArray_Type);
        DECL_NPY_API(PyVoidArrType_Type);
        DECL_NPY_API(PyArrayDescr_Type);
        DECL_NPY_API(PyArray_DescrFromType);
        DECL_NPY_API(PyArray_DescrFromScalar);
        DECL_NPY_API(PyArray_FromAny);
        DECL_NPY_API(PyArray_Resize);
        DECL_NPY_API(PyArray_CopyInto);
        DECL_NPY_API(PyArray_NewCopy);
        DECL_NPY_API(PyArray_NewFromDescr);
        DECL_NPY_API(PyArray_DescrNewFromType);
        DECL_NPY_API(PyArray_DescrConverter);
        DECL_NPY_API(PyArray_EquivTypes);
        DECL_NPY_API(PyArray_GetArrayParamsFromObject);
        DECL_NPY_API(PyArray_Squeeze);
        DECL_NPY_API(PyArray_SetBaseObject);
#undef DECL_NPY_API
        return api;
    }